

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

void RangeEnc_EncodeBit_1(CPpmd7z_RangeEnc *p,UInt32 size0)

{
  uint uVar1;
  UInt32 newBound;
  UInt32 size0_local;
  CPpmd7z_RangeEnc *p_local;
  
  uVar1 = (p->Range >> 0xe) * size0;
  p->Low = (ulong)uVar1 + p->Low;
  p->Range = p->Range - uVar1;
  while (p->Range < 0x1000000) {
    p->Range = p->Range << 8;
    RangeEnc_ShiftLow(p);
  }
  return;
}

Assistant:

static void RangeEnc_EncodeBit_1(CPpmd7z_RangeEnc *p, UInt32 size0)
{
  UInt32 newBound = (p->Range >> 14) * size0;
  p->Low += newBound;
  p->Range -= newBound;
  while (p->Range < kTopValue)
  {
    p->Range <<= 8;
    RangeEnc_ShiftLow(p);
  }
}